

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O3

void __thiscall
mp::NLFeeder_Easy::FeedRowAndObjNames<mp::StringFileWriter>
          (NLFeeder_Easy *this,StringFileWriter *wrt)

{
  bool bVar1;
  long lVar2;
  
  if ((this->nlme_).row_names_ == (char **)0x0) {
    return;
  }
  if (wrt->fTriedOpen_ == false) {
    bVar1 = StringFileWriter::Open(wrt);
    if (!bVar1) {
      return;
    }
  }
  else if ((wrt->nm).f_ == (FILE *)0x0) {
    return;
  }
  if (0 < (this->nlme_).num_row_) {
    lVar2 = 0;
    do {
      StringFileWriter::Write<char_const*>(wrt,(this->nlme_).row_names_[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->nlme_).num_row_);
  }
  StringFileWriter::Write<char_const*>(wrt,(this->nlme_).obj_name_);
  return;
}

Assistant:

void FeedRowAndObjNames(RowObjNameWriter& wrt) {
    if (NLME().RowNames() && wrt) {
      for (int i=0; i<NLME().NumRows(); ++i)
        wrt << NLME().RowNames()[i];
      wrt << NLME().ObjName();
    }
  }